

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O3

int __thiscall CTYPECommand::doWhat(CTYPECommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  string *psVar3;
  string ret;
  string local_30;
  
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"530 Please login with USER and PASS.\r\n","");
    CClient::sendMsg(pClient,&local_30);
LAB_00108b52:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    iVar2 = -1;
  }
  else {
    psVar3 = &(this->super_CCommand).m_Args;
    iVar2 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar2 == 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"200 Switching to Binary mode.\r\n","");
      CClient::sendMsg(pClient,&local_30);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar3);
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      if (iVar2 != 0) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_30,"500 Unrecognised TYPE command.\r\n","");
        CClient::sendMsg(pClient,&local_30);
        goto LAB_00108b52;
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"200 Switching to ASCII mode.\r\n","");
      CClient::sendMsg(pClient,&local_30);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CTYPECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        if(m_Args == "I"){
            string ret = "200 Switching to Binary mode.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else if(m_Args == "A"){
            string ret = "200 Switching to ASCII mode.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        // there should have some orther type mode.
        else{
            string ret = "500 Unrecognised TYPE command.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}